

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

int moveto_snode(lyxp_set *set,lys_node *cur_node,char *qname,uint16_t qname_len,int options)

{
  uint32_t uVar1;
  ly_ctx *ctx;
  lyxp_set *plVar2;
  lyxp_set_type lVar3;
  lyxp_node_type lVar4;
  int iVar5;
  int iVar6;
  lys_module *moveto_mod;
  lys_module *module;
  lys_node *plVar7;
  undefined6 in_register_0000000a;
  long lVar8;
  char *pcVar9;
  long lVar10;
  uint uVar11;
  bool bVar12;
  lyxp_node_type local_50;
  int local_4c;
  lyxp_node_type root_type;
  undefined4 uStack_44;
  int local_3c;
  lyxp_set *local_38;
  
  lVar3 = set->type;
  switch(lVar3) {
  case LYXP_SET_EMPTY:
    goto switchD_0016f9b1_caseD_0;
  case LYXP_SET_NODE_SET:
    pcVar9 = "node set";
    break;
  case LYXP_SET_SNODE_SET:
    ctx = cur_node->module->ctx;
    local_4c = options;
    local_38 = set;
    moveto_snode_get_root(cur_node,options,&local_50);
    _root_type = (char *)CONCAT44(uStack_44,(int)CONCAT62(in_register_0000000a,qname_len));
    pcVar9 = strnchr(qname,0x3a,(uint)qname_len);
    if (pcVar9 == (char *)0x0) {
      moveto_mod = (lys_module *)0x0;
      lVar4 = root_type;
LAB_0016fa85:
      _root_type = lydict_insert(ctx,qname,(ulong)(lVar4 & 0xffff));
      uVar1 = local_38->used;
      lVar10 = (long)(int)uVar1;
      if (lVar10 < 1) {
        bVar12 = false;
      }
      else {
        lVar8 = 0;
        local_3c = 0;
        iVar6 = local_4c;
        do {
          if ((local_38->val).nodes[lVar8].pos == 1) {
            (local_38->val).nodes[lVar8].pos = 0;
            if ((local_38->val).nodes[lVar8].type < LYXP_NODE_ELEM) {
              plVar7 = (lys_node *)0x0;
              while( true ) {
                module = moveto_mod;
                if (moveto_mod == (lys_module *)0x0) {
                  module = lys_node_module((lys_node *)(local_38->val).nodes[lVar8].node);
                }
                plVar7 = lys_getnext(plVar7,(lys_node *)0x0,module,0);
                if (plVar7 == (lys_node *)0x0) break;
                iVar5 = moveto_snode_check(plVar7,local_50,_root_type,moveto_mod,iVar6);
                if (iVar5 == 0) {
                  iVar5 = set_snode_insert_node(local_38,plVar7,LYXP_NODE_ELEM);
                  if (lVar8 < iVar5 && iVar5 < (int)uVar1) {
                    (local_38->val).nodes[iVar5].pos = 2;
                    local_3c = 1;
                  }
                }
              }
            }
            else if (((ulong)(local_38->val).nodes[lVar8].node[1].schema & 0x802c) == 0) {
              plVar7 = lys_getnext((lys_node *)0x0,(lys_node *)(local_38->val).nodes[lVar8].node,
                                   (lys_module *)0x0,0);
              while (plVar7 != (lys_node *)0x0) {
                iVar6 = moveto_snode_check(plVar7,local_50,_root_type,moveto_mod,iVar6);
                plVar2 = local_38;
                if (iVar6 == 0) {
                  iVar6 = set_snode_insert_node(local_38,plVar7,LYXP_NODE_ELEM);
                  if (lVar8 < iVar6 && iVar6 < (int)uVar1) {
                    (plVar2->val).nodes[iVar6].pos = 2;
                    local_3c = 1;
                  }
                }
                plVar7 = lys_getnext(plVar7,(lys_node *)(plVar2->val).nodes[lVar8].node,
                                     (lys_module *)0x0,0);
                iVar6 = local_4c;
              }
            }
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 != lVar10);
        bVar12 = local_3c != 0;
      }
      lydict_remove(ctx,_root_type);
      if (!bVar12 || (int)uVar1 < 1) {
        return 0;
      }
      lVar8 = 0;
      do {
        if (*(int *)((long)&((local_38->val).nodes)->pos + lVar8) == 2) {
          *(undefined4 *)((long)&((local_38->val).nodes)->pos + lVar8) = 1;
        }
        lVar8 = lVar8 + 0x10;
      } while (lVar10 * 0x10 != lVar8);
      return 0;
    }
    uVar11 = (int)pcVar9 - (int)qname;
    moveto_mod = moveto_resolve_model(qname,(uint16_t)uVar11,ctx,cur_node,options);
    if (moveto_mod != (lys_module *)0x0) {
      qname = qname + (long)(int)uVar11 + 1;
      lVar4 = ~uVar11 + root_type;
      goto LAB_0016fa85;
    }
    ly_vlog(LYE_XPATH_INMOD,LY_VLOG_NONE,(void *)0x0,(ulong)uVar11,qname);
    goto LAB_0016fa6b;
  case LYXP_SET_BOOLEAN:
    pcVar9 = "boolean";
    break;
  case LYXP_SET_NUMBER:
    pcVar9 = "number";
    break;
  case LYXP_SET_STRING:
    pcVar9 = "string";
    break;
  default:
    pcVar9 = (char *)0x0;
  }
  ly_vlog(LYE_XPATH_INOP_1,LY_VLOG_NONE,(void *)0x0,"path operator",pcVar9);
LAB_0016fa6b:
  lVar3 = ~LYXP_SET_EMPTY;
switchD_0016f9b1_caseD_0:
  return lVar3;
}

Assistant:

static int
moveto_snode(struct lyxp_set *set, struct lys_node *cur_node, const char *qname, uint16_t qname_len, int options)
{
    int i, orig_used, pref_len, idx, temp_ctx = 0;
    const char *ptr, *name_dict = NULL; /* optimalization - so we can do (==) instead (!strncmp(...)) in moveto_node_check() */
    struct lys_module *moveto_mod;
    const struct lys_node *sub;
    struct ly_ctx *ctx;
    enum lyxp_node_type root_type;

    if (!set || (set->type == LYXP_SET_EMPTY)) {
        return EXIT_SUCCESS;
    }

    if (set->type != LYXP_SET_SNODE_SET) {
        LOGVAL(LYE_XPATH_INOP_1, LY_VLOG_NONE, NULL, "path operator", print_set_type(set));
        return -1;
    }

    ctx = cur_node->module->ctx;
    moveto_snode_get_root(cur_node, options, &root_type);

    /* prefix */
    if ((ptr = strnchr(qname, ':', qname_len))) {
        pref_len = ptr - qname;
        moveto_mod = moveto_resolve_model(qname, pref_len, ctx, cur_node, 1);
        if (!moveto_mod) {
            LOGVAL(LYE_XPATH_INMOD, LY_VLOG_NONE, NULL, pref_len, qname);
            return -1;
        }
        qname += pref_len + 1;
        qname_len -= pref_len + 1;
    } else {
        moveto_mod = NULL;
    }

    /* name */
    name_dict = lydict_insert(ctx, qname, qname_len);

    orig_used = set->used;
    for (i = 0; i < orig_used; ++i) {
        if (set->val.snodes[i].in_ctx != 1) {
            continue;
        }
        set->val.snodes[i].in_ctx = 0;

        if ((set->val.snodes[i].type == LYXP_NODE_ROOT_CONFIG) || (set->val.snodes[i].type == LYXP_NODE_ROOT)) {
            /* it can actually be in any module, it's all <running>, but we know it's moveto_mod (if set),
             * so use it directly (root node itself is useless in this case) */
            sub = NULL;
            while ((sub = lys_getnext(sub, NULL, (moveto_mod ? moveto_mod : lys_node_module(set->val.snodes[i].snode)), 0))) {
                if (!moveto_snode_check(sub, root_type, name_dict, moveto_mod, options)) {
                    idx = set_snode_insert_node(set, sub, LYXP_NODE_ELEM);
                    /* we need to prevent these nodes to be considered in this moveto */
                    if ((idx < orig_used) && (idx > i)) {
                        set->val.snodes[idx].in_ctx = 2;
                        temp_ctx = 1;
                    }
                }
            }

        /* skip nodes without children - leaves, leaflists, and anyxmls (ouput root will eval to true) */
        } else if (!(set->val.snodes[i].snode->nodetype & (LYS_LEAF | LYS_LEAFLIST | LYS_ANYDATA))) {
            sub = NULL;
            while ((sub = lys_getnext(sub, set->val.snodes[i].snode, NULL, 0))) {
                if (!moveto_snode_check(sub, root_type, name_dict, moveto_mod, options)) {
                    idx = set_snode_insert_node(set, sub, LYXP_NODE_ELEM);
                    if ((idx < orig_used) && (idx > i)) {
                        set->val.snodes[idx].in_ctx = 2;
                        temp_ctx = 1;
                    }
                }
            }
        }
    }
    lydict_remove(ctx, name_dict);

    /* correct temporary in_ctx values */
    if (temp_ctx) {
        for (i = 0; i < orig_used; ++i) {
            if (set->val.snodes[i].in_ctx == 2) {
                set->val.snodes[i].in_ctx = 1;
            }
        }
    }

    return EXIT_SUCCESS;
}